

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.hh
# Opt level: O2

GenericDatum * __thiscall avro::Node::defaultValueAt(Node *this,int index)

{
  Exception *this_00;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  int index_local;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  
  index_local = index;
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_f8,"No default value at: %1%");
  msg = boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,int&>
                  (&local_f8,&index_local);
  Exception::Exception(this_00,msg);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

virtual const GenericDatum& defaultValueAt(int index) {
        throw Exception(boost::format("No default value at: %1%") % index);
    }